

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

times * __thiscall lest::times::operator()(times *this,test *testing)

{
  env *__args;
  ostream *poVar1;
  double dVar2;
  timer t;
  duration local_48;
  text local_40;
  
  local_48.__r = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string((string *)&local_40,(string *)testing);
  __args = env::operator()(&this->output,&local_40);
  std::function<void_(lest::env_&)>::operator()(&testing->behaviour,__args);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = (this->super_action).os;
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 3;
  dVar2 = timer::elapsed_seconds((timer *)&local_48);
  poVar1 = std::ostream::_M_insert<double>(dVar2 * 1000.0);
  poVar1 = std::operator<<(poVar1," ms: ");
  poVar1 = std::operator<<(poVar1,(string *)testing);
  std::operator<<(poVar1,"\n");
  return this;
}

Assistant:

times & operator()( test testing )
    {
        timer t;

        try
        {
            testing.behaviour( output( testing.name ) );
        }
        catch( message const & )
        {
            ++failures;
        }

        os << std::setw(3) << ( 1000 * t.elapsed_seconds() ) << " ms: " << testing.name  << "\n";

        return *this;
    }